

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Performance::EmptyWorkloadReferenceCase::writeWorkload
          (EmptyWorkloadReferenceCase *this,ostringstream *dst,char *resultVariableName,
          char *inputVariableName)

{
  ostream *poVar1;
  char *inputVariableName_local;
  char *resultVariableName_local;
  ostringstream *dst_local;
  EmptyWorkloadReferenceCase *this_local;
  
  poVar1 = std::operator<<((ostream *)dst,"\t");
  poVar1 = std::operator<<(poVar1,resultVariableName);
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = std::operator<<(poVar1,inputVariableName);
  std::operator<<(poVar1,";\n");
  return;
}

Assistant:

void writeWorkload (std::ostringstream& dst, const char* resultVariableName, const char* inputVariableName) const
	{
		dst << "\t" << resultVariableName << " = " << inputVariableName << ";\n";
	}